

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

BooleanColumnReader * __thiscall
duckdb::ColumnReader::Cast<duckdb::BooleanColumnReader>(ColumnReader *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->column_schema->type).physical_type_ == BOOL) {
    return (BooleanColumnReader *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast column reader to type - type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const LogicalType &Type() const {
		return column_schema.type;
	}